

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChFrame<double> *
chrono::operator*(ChFrame<double> *__return_storage_ptr__,ChFrameMoving<double> *Fa,
                 ChFrame<double> *Fb)

{
  ChQuaternion<double> local_38;
  
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  __return_storage_ptr__->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  (__return_storage_ptr__->coord).pos.m_data[0] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[0] = 1.0;
  (__return_storage_ptr__->coord).rot.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&__return_storage_ptr__->Amatrix,&local_38);
  ChFrame<double>::TransformLocalToParent(&Fa->super_ChFrame<double>,Fb,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrame<Real> operator*(const ChFrameMoving<Real>& Fa, const ChFrame<Real>& Fb) {
    // note: it should be not needed: falling back to ChFrame = ChFrame * ChFrame
    // could be enough, but the compiler still needs this operator.. why?
    ChFrame<Real> res;
    Fa.ChFrame<Real>::TransformLocalToParent(Fb, res);
    return res;
}